

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::plot
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,char *filename)

{
  size_t sVar1;
  pointer pvVar2;
  ostream *poVar3;
  pointer pdVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  stringstream gnuplot_script;
  ofstream out;
  long *local_3d8;
  long local_3c8 [2];
  stringstream local_3b8 [16];
  long local_3a8 [14];
  ios_base local_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::__cxx11::stringstream::stringstream(local_3b8);
  if (filename == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_3a8 + (int)*(undefined8 *)(local_3a8[0] + -0x18));
  }
  else {
    sVar1 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,filename,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"_GnuplotScript",0xe);
  std::__cxx11::stringbuf::str();
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_3d8);
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"plot      \'-\' matrix with image",0x1f);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  cVar6 = (char)&local_230;
  std::ostream::put(cVar6);
  std::ostream::flush();
  pvVar2 = (this->heat_map).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->heat_map).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
    lVar5 = 0;
    do {
      pdVar4 = pvVar2[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvVar2[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar4) {
        lVar7 = 0;
        do {
          poVar3 = std::ostream::_M_insert<double>(pdVar4[lVar7]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          lVar7 = lVar7 + 1;
          pvVar2 = (this->heat_map).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar4 = pvVar2[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (lVar7 != (long)*(pointer *)
                                 ((long)&pvVar2[lVar5].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + 8) - (long)pdVar4 >> 3);
      }
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      lVar5 = lVar5 + 1;
      pvVar2 = (this->heat_map).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 != ((long)(this->heat_map).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                      -0x5555555555555555);
  }
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'",
             0x4f);
  std::__cxx11::stringbuf::str();
  if (local_3d8 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::clog + -0x18) + 0x109038);
  }
  else {
    sVar1 = strlen((char *)local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,(char *)local_3d8,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"\'\"",2);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3b8);
  std::ios_base::~ios_base(local_338);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::plot(const char* filename) const {
  std::ofstream out;
  std::stringstream gnuplot_script;
  gnuplot_script << filename << "_GnuplotScript";

  out.open(gnuplot_script.str().c_str());
  out << "plot      '-' matrix with image" << std::endl;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      out << this->heat_map[i][j] << " ";
    }
    out << std::endl;
  }
  out.close();
  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
}